

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

bool __thiscall libcellml::Importer::resolveImports(Importer *this,ModelPtr *model,string *basePath)

{
  IssueImpl *this_00;
  bool bVar1;
  ImporterImpl *pIVar2;
  element_type *peVar3;
  element_type *peVar4;
  Logger local_160;
  reference local_150;
  ComponentPtr *component;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  local_128;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  *local_110;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  *__range1_1;
  reference local_f8;
  UnitsPtr *units;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  local_d0;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *local_b8;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  *__range1;
  string normalisedBasePath;
  string local_88;
  undefined1 local_68 [8];
  IssuePtr issue;
  undefined1 local_48 [8];
  History history;
  bool status;
  string *basePath_local;
  ModelPtr *model_local;
  Importer *this_local;
  
  history.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::vector((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            *)local_48);
  pIVar2 = pFunc(this);
  Logger::LoggerImpl::removeAllIssues(&pIVar2->super_LoggerImpl);
  bVar1 = std::operator==(model,(nullptr_t)0x0);
  if (bVar1) {
    Issue::IssueImpl::create();
    peVar3 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
    this_00 = peVar3->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Cannot resolve imports for null model.",
               (allocator<char> *)(normalisedBasePath.field_2._M_local_buf + 0xf));
    Issue::IssueImpl::setDescription(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator
              ((allocator<char> *)(normalisedBasePath.field_2._M_local_buf + 0xf));
    peVar3 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
    Issue::IssueImpl::setReferenceRule(peVar3->mPimpl,IMPORTER_NULL_MODEL);
    pIVar2 = pFunc(this);
    Logger::LoggerImpl::addIssue(&pIVar2->super_LoggerImpl,(IssuePtr *)local_68);
    this_local._7_1_ = false;
    normalisedBasePath.field_2._8_4_ = 1;
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_68);
  }
  else {
    clearImports(this,model);
    normalisePath((string *)&__range1,basePath);
    std::shared_ptr<libcellml::Model_const>::shared_ptr<libcellml::Model,void>
              ((shared_ptr<libcellml::Model_const> *)&__begin1,model);
    getImportedUnits(&local_d0,(ModelConstPtr *)&__begin1);
    std::shared_ptr<const_libcellml::Model>::~shared_ptr
              ((shared_ptr<const_libcellml::Model> *)&__begin1);
    local_b8 = &local_d0;
    __end1 = std::
             vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             ::begin(local_b8);
    units = (UnitsPtr *)
            std::
            vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
            ::end(local_b8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                                  *)&units);
      if (!bVar1) break;
      local_f8 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                 ::operator*(&__end1);
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::clear((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               *)local_48);
      pIVar2 = pFunc(this);
      bVar1 = ImporterImpl::fetchUnits(pIVar2,local_f8,(string *)&__range1,(History *)local_48);
      if (!bVar1) {
        Logger::issueCount(&this->super_Logger);
        Logger::issue((Logger *)&__range1_1,(size_t)this);
        peVar3 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range1_1);
        peVar4 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar3->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar4->mPimpl,local_f8);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)&__range1_1);
        history.
        super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
      ::operator++(&__end1);
    }
    normalisedBasePath.field_2._8_4_ = 2;
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector(&local_d0);
    std::shared_ptr<libcellml::ComponentEntity_const>::shared_ptr<libcellml::Model,void>
              ((shared_ptr<libcellml::ComponentEntity_const> *)&__begin1_1,model);
    getImportedComponents(&local_128,(ComponentEntityConstPtr *)&__begin1_1);
    std::shared_ptr<const_libcellml::ComponentEntity>::~shared_ptr
              ((shared_ptr<const_libcellml::ComponentEntity> *)&__begin1_1);
    local_110 = &local_128;
    __end1_1 = std::
               vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               ::begin(local_110);
    component = (ComponentPtr *)
                std::
                vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ::end(local_110);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                          *)&component);
      if (!bVar1) break;
      local_150 = __gnu_cxx::
                  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
                  ::operator*(&__end1_1);
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::clear((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               *)local_48);
      pIVar2 = pFunc(this);
      bVar1 = ImporterImpl::fetchComponent(pIVar2,local_150,(string *)&__range1,(History *)local_48)
      ;
      if (!bVar1) {
        Logger::issueCount(&this->super_Logger);
        Logger::issue(&local_160,(size_t)this);
        peVar3 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_160);
        peVar4 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar3->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setComponent(peVar4->mPimpl,local_150,COMPONENT);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)&local_160);
        history.
        super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
      ::operator++(&__end1_1);
    }
    normalisedBasePath.field_2._8_4_ = 4;
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::~vector(&local_128);
    this_local._7_1_ =
         (bool)(history.
                super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
    normalisedBasePath.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&__range1);
  }
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::~vector((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             *)local_48);
  return this_local._7_1_;
}

Assistant:

bool Importer::resolveImports(ModelPtr &model, const std::string &basePath)
{
    bool status = true;
    History history;

    pFunc()->removeAllIssues();

    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Cannot resolve imports for null model.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        pFunc()->addIssue(issue);
        return false;
    }

    clearImports(model);
    auto normalisedBasePath = normalisePath(basePath);

    for (const UnitsPtr &units : getImportedUnits(model)) {
        history.clear();
        if (!pFunc()->fetchUnits(units, normalisedBasePath, history)) {
            // Get the last issue recorded and change its object to be the top-level importing item.
            issue(issueCount() - 1)->mPimpl->mItem->mPimpl->setUnits(units);
            status = false;
        }
    }

    for (const ComponentPtr &component : getImportedComponents(model)) {
        history.clear();
        if (!pFunc()->fetchComponent(component, normalisedBasePath, history)) {
            issue(issueCount() - 1)->mPimpl->mItem->mPimpl->setComponent(component);
            status = false;
        }
    }

    return status;
}